

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O3

LY_ERR ly_nested_ext_schema
                 (lyd_node *parent,lysc_node *sparent,char *prefix,size_t prefix_len,
                 LY_VALUE_FORMAT format,void *prefix_data,char *name,size_t name_len,
                 lysc_node **snode,lysc_ext_instance **ext)

{
  lyplg_ext *plVar1;
  lyplg_ext_data_snode_clb p_Var2;
  LY_ERR LVar3;
  lysc_node *plVar4;
  void *pvVar5;
  lysc_ext_instance *plVar6;
  lysc_ext_instance *plVar7;
  void *pvVar8;
  
  if (((parent == (lyd_node *)0x0) || (plVar4 = parent->schema, parent->schema == (lysc_node *)0x0))
     && (plVar4 = sparent, sparent == (lysc_node *)0x0)) {
    plVar7 = (lysc_ext_instance *)0x0;
  }
  else {
    plVar7 = plVar4->exts;
  }
  pvVar8 = (void *)0x0;
  plVar6 = plVar7;
  while( true ) {
    if (plVar7 == (lysc_ext_instance *)0x0) {
      pvVar5 = (void *)0x0;
    }
    else {
      pvVar5 = plVar7[-1].compiled;
    }
    if (pvVar5 <= pvVar8) break;
    plVar1 = plVar6->def->plugin;
    if (((plVar1 != (lyplg_ext *)0x0) &&
        (p_Var2 = plVar1->snode, p_Var2 != (lyplg_ext_data_snode_clb)0x0)) &&
       (LVar3 = (*p_Var2)(plVar6,parent,sparent,prefix,prefix_len,format,prefix_data,name,name_len,
                          snode), LVar3 != LY_ENOT)) {
      if ((LVar3 == LY_SUCCESS) && (LVar3 = LY_SUCCESS, ext != (lysc_ext_instance **)0x0)) {
        *ext = plVar6;
      }
      return LVar3;
    }
    pvVar8 = (void *)((long)pvVar8 + 1);
    plVar6 = plVar6 + 1;
  }
  return LY_ENOT;
}

Assistant:

LY_ERR
ly_nested_ext_schema(const struct lyd_node *parent, const struct lysc_node *sparent, const char *prefix,
        size_t prefix_len, LY_VALUE_FORMAT format, void *prefix_data, const char *name, size_t name_len,
        const struct lysc_node **snode, struct lysc_ext_instance **ext)
{
    LY_ERR r;
    LY_ARRAY_COUNT_TYPE u;
    struct lysc_ext_instance *nested_exts = NULL;
    lyplg_ext_data_snode_clb ext_snode_cb;

    /* check if there are any nested extension instances */
    if (parent && parent->schema) {
        nested_exts = parent->schema->exts;
    } else if (sparent) {
        nested_exts = sparent->exts;
    }
    LY_ARRAY_FOR(nested_exts, u) {
        if (!nested_exts[u].def->plugin) {
            /* no plugin */
            continue;
        }

        ext_snode_cb = nested_exts[u].def->plugin->snode;
        if (!ext_snode_cb) {
            /* not an extension with nested data */
            continue;
        }

        /* try to get the schema node */
        r = ext_snode_cb(&nested_exts[u], parent, sparent, prefix, prefix_len, format, prefix_data, name, name_len, snode);
        if (!r) {
            if (ext) {
                /* data successfully created, remember the ext instance */
                *ext = &nested_exts[u];
            }
            return LY_SUCCESS;
        } else if (r != LY_ENOT) {
            /* fatal error */
            return r;
        }
        /* data was not from this module, continue */
    }

    /* no extensions or none matched */
    return LY_ENOT;
}